

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_block_sizes.cpp
# Opt level: O0

void assign_kmeans_texels(block_size_descriptor *bsd)

{
  ulong uVar1;
  int iVar2;
  long in_RDI;
  uint8_t texel;
  uint arr_elements_set;
  uint8_t i_1;
  bool seen [216];
  uint64_t rng_state [2];
  uint8_t i;
  uint local_110;
  byte local_109;
  byte abStack_108 [224];
  astc local_28 [31];
  byte local_9;
  long local_8;
  
  if (*(byte *)(in_RDI + 3) < 0x41) {
    for (local_9 = 0; local_9 < *(byte *)(in_RDI + 3); local_9 = local_9 + 1) {
      *(byte *)(in_RDI + 0xe15740 + (ulong)local_9) = local_9;
    }
  }
  else {
    local_8 = in_RDI;
    astc::rand_init((uint64_t *)(abStack_108 + 0xe0));
    for (local_109 = 0; local_109 < *(byte *)(local_8 + 3); local_109 = local_109 + 1) {
      abStack_108[local_109] = 0;
    }
    local_110 = 0;
    while (local_110 < 0x40) {
      iVar2 = astc::rand((astc *)(abStack_108 + 0xe0));
      uVar1 = (ulong)(byte)iVar2 % (ulong)(long)(int)(uint)*(byte *)(local_8 + 3);
      if ((abStack_108[uVar1] & 1) == 0) {
        *(char *)(local_8 + 0xe15740 + (ulong)local_110) = (char)uVar1;
        abStack_108[uVar1] = 1;
        local_110 = local_110 + 1;
      }
    }
  }
  return;
}

Assistant:

static void assign_kmeans_texels(
	block_size_descriptor& bsd
) {
	// Use all texels for kmeans on a small block
	if (bsd.texel_count <= BLOCK_MAX_KMEANS_TEXELS)
	{
		for (uint8_t i = 0; i < bsd.texel_count; i++)
		{
			bsd.kmeans_texels[i] = i;
		}

		return;
	}

	// Select a random subset of BLOCK_MAX_KMEANS_TEXELS for kmeans on a large block
	uint64_t rng_state[2];
	astc::rand_init(rng_state);

	// Initialize array used for tracking used indices
	bool seen[BLOCK_MAX_TEXELS];
	for (uint8_t i = 0; i < bsd.texel_count; i++)
	{
		seen[i] = false;
	}

	// Assign 64 random indices, retrying if we see repeats
	unsigned int arr_elements_set = 0;
	while (arr_elements_set < BLOCK_MAX_KMEANS_TEXELS)
	{
		uint8_t texel = static_cast<uint8_t>(astc::rand(rng_state));
		texel = texel % bsd.texel_count;
		if (!seen[texel])
		{
			bsd.kmeans_texels[arr_elements_set++] = texel;
			seen[texel] = true;
		}
	}
}